

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbjava.cpp
# Opt level: O1

string * trim(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  size_type sVar2;
  char *pcVar3;
  char *pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __tmp;
  char *pcVar5;
  
  pcVar3 = (s->_M_dataplus)._M_p;
  sVar2 = s->_M_string_length;
  pcVar5 = pcVar3 + sVar2;
  pcVar4 = pcVar3;
  while ((sVar2 != 0 && (iVar1 = isspace((int)*pcVar3), pcVar4 = pcVar3, iVar1 != 0))) {
    pcVar3 = pcVar3 + 1;
    sVar2 = sVar2 - 1;
    pcVar4 = pcVar5;
  }
  do {
    pcVar3 = pcVar4;
    if (pcVar5 == pcVar4) break;
    iVar1 = isspace((int)pcVar5[-1]);
    pcVar3 = pcVar5;
    pcVar5 = pcVar5 + -1;
  } while (iVar1 != 0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

string trim(const string& s)
{
	auto it = s.cbegin();
	while (it != s.end() && isspace(*it))
		++it;

	auto rit = s.crbegin();
	while (rit.base() != it && isspace(*rit))
		++rit;

	return string(it, rit.base());
}